

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c-leakcheck.h
# Opt level: O3

void check_for_fd_leaks(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int fds_2 [2];
  int fds_1 [2];
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  iVar1 = pipe(&local_8);
  if (iVar1 == 0) {
    iVar1 = pipe(&local_10);
    if (iVar1 == 0) {
      if (local_8 == fd_leak_test_a) {
        if (local_4 == fd_leak_test_b) {
          if (local_10 == fd_leak_test_c) {
            if (local_c == fd_leak_test_d) {
              iVar1 = close(local_8);
              if (iVar1 == 0) {
                iVar1 = close(local_4);
                if (iVar1 == 0) {
                  iVar1 = close(local_10);
                  if (iVar1 == 0) {
                    iVar1 = close(local_c);
                    if (iVar1 == 0) {
                      return;
                    }
                    pcVar2 = "close(fds_2[1]) == 0";
                    uVar3 = 0x3c;
                  }
                  else {
                    pcVar2 = "close(fds_2[0]) == 0";
                    uVar3 = 0x3b;
                  }
                }
                else {
                  pcVar2 = "close(fds_1[1]) == 0";
                  uVar3 = 0x3a;
                }
              }
              else {
                pcVar2 = "close(fds_1[0]) == 0";
                uVar3 = 0x39;
              }
            }
            else {
              pcVar2 = "fds_2[1] == fd_leak_test_d";
              uVar3 = 0x37;
            }
          }
          else {
            pcVar2 = "fds_2[0] == fd_leak_test_c";
            uVar3 = 0x36;
          }
        }
        else {
          pcVar2 = "fds_1[1] == fd_leak_test_b";
          uVar3 = 0x35;
        }
      }
      else {
        pcVar2 = "fds_1[0] == fd_leak_test_a";
        uVar3 = 0x34;
      }
    }
    else {
      pcVar2 = "pipe(fds_2) == 0";
      uVar3 = 0x32;
    }
  }
  else {
    pcVar2 = "pipe(fds_1) == 0";
    uVar3 = 0x2f;
  }
  microatf_fail_require
            ("%s:%d: %s not met",
             "/workspace/llm4binary/github/license_all_cmakelists_25/owl-compositor[P]epoll-shim/test/atf-c-leakcheck.h"
             ,uVar3,pcVar2);
}

Assistant:

static void
check_for_fd_leaks(void)
{
	/* Test that all fds of previous tests
	 * have been closed successfully. */

	int fds_1[2];
	ATF_REQUIRE(pipe(fds_1) == 0);

	int fds_2[2];
	ATF_REQUIRE(pipe(fds_2) == 0);

	ATF_REQUIRE(fds_1[0] == fd_leak_test_a);
	ATF_REQUIRE(fds_1[1] == fd_leak_test_b);
	ATF_REQUIRE(fds_2[0] == fd_leak_test_c);
	ATF_REQUIRE(fds_2[1] == fd_leak_test_d);

	ATF_REQUIRE(close(fds_1[0]) == 0);
	ATF_REQUIRE(close(fds_1[1]) == 0);
	ATF_REQUIRE(close(fds_2[0]) == 0);
	ATF_REQUIRE(close(fds_2[1]) == 0);
}